

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

char * __thiscall
cmsys::SystemInformationImplementation::GetVendorID(SystemInformationImplementation *this)

{
  SystemInformationImplementation *this_local;
  
  switch(this->ChipManufacturer) {
  case AMD:
    this_local = (SystemInformationImplementation *)0x181e1a;
    break;
  case Intel:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_578ef;
    break;
  case NSC:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_57911;
    break;
  case UMC:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_57955;
    break;
  case Cyrix:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_5791c;
    break;
  case NexGen:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_57933;
    break;
  case IDT:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_5794a;
    break;
  case Rise:
    this_local = (SystemInformationImplementation *)0x181f19;
    break;
  case Transmeta:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_57977;
    break;
  case Sun:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_57982;
    break;
  case IBM:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_57999;
    break;
  case Motorola:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_579b0;
    break;
  case HP:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_579c7;
    break;
  case UnknownManufacturer:
  default:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_579de;
  }
  return (char *)this_local;
}

Assistant:

const char* SystemInformationImplementation::GetVendorID()
{
  // Return the vendor ID.
  switch (this->ChipManufacturer) {
    case Intel:
      return "Intel Corporation";
    case AMD:
      return "Advanced Micro Devices";
    case NSC:
      return "National Semiconductor";
    case Cyrix:
      return "Cyrix Corp., VIA Inc.";
    case NexGen:
      return "NexGen Inc., Advanced Micro Devices";
    case IDT:
      return "IDT\\Centaur, Via Inc.";
    case UMC:
      return "United Microelectronics Corp.";
    case Rise:
      return "Rise";
    case Transmeta:
      return "Transmeta";
    case Sun:
      return "Sun Microelectronics";
    case IBM:
      return "IBM";
    case Motorola:
      return "Motorola";
    case HP:
      return "Hewlett-Packard";
    case UnknownManufacturer:
    default:
      return "Unknown Manufacturer";
  }
}